

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_compiler.c
# Opt level: O1

MOJOSHADER_astData *
MOJOSHADER_parseAst(char *srcprofile,char *filename,char *source,uint sourcelen,
                   MOJOSHADER_preprocessorDefine *defs,uint define_count,
                   MOJOSHADER_includeOpen include_open,MOJOSHADER_includeClose include_close,
                   MOJOSHADER_malloc m,MOJOSHADER_free f,void *d)

{
  int iVar1;
  Context_conflict *ctx;
  MOJOSHADER_astData *pMVar2;
  MOJOSHADER_error *pMVar3;
  MOJOSHADER_free p_Var4;
  
  if (((m != (MOJOSHADER_malloc)0x0 || f == (MOJOSHADER_free)0x0) &&
      (m == (MOJOSHADER_malloc)0x0 || f != (MOJOSHADER_free)0x0)) &&
     (ctx = build_context(m,f,d), ctx != (Context_conflict *)0x0)) {
    choose_src_profile(ctx,srcprofile);
    if (ctx->isfail == 0) {
      parse_source(ctx,filename,source,sourcelen,defs,define_count,include_open,include_close);
    }
    if (ctx->isfail != 0) {
      pMVar2 = &MOJOSHADER_out_of_mem_ast_data;
      if (ctx->out_of_memory == 0) {
        pMVar2 = (MOJOSHADER_astData *)(*ctx->malloc)(0x40,ctx->malloc_data);
        if (pMVar2 == (MOJOSHADER_astData *)0x0) {
          ctx->isfail = 1;
          ctx->out_of_memory = 1;
          pMVar2 = &MOJOSHADER_out_of_mem_ast_data;
        }
        else {
          pMVar2->malloc_data = (void *)0x0;
          pMVar2->opaque = (void *)0x0;
          pMVar2->malloc = (MOJOSHADER_malloc)0x0;
          pMVar2->free = (MOJOSHADER_free)0x0;
          pMVar2->source_profile = (char *)0x0;
          pMVar2->ast = (MOJOSHADER_astNode *)0x0;
          *(undefined8 *)pMVar2 = 0;
          pMVar2->errors = (MOJOSHADER_error *)0x0;
          pMVar2->source_profile = ctx->source_profile;
          p_Var4 = (MOJOSHADER_free)ctx->malloc;
          if (ctx->malloc == MOJOSHADER_internal_malloc) {
            p_Var4 = (MOJOSHADER_free)0x0;
          }
          pMVar2->malloc = (MOJOSHADER_malloc)p_Var4;
          p_Var4 = ctx->free;
          if (ctx->free == MOJOSHADER_internal_free) {
            p_Var4 = (MOJOSHADER_free)0x0;
          }
          pMVar2->free = p_Var4;
          pMVar2->malloc_data = ctx->malloc_data;
          iVar1 = errorlist_count(ctx->errors);
          pMVar2->error_count = iVar1;
          pMVar3 = errorlist_flatten(ctx->errors);
          pMVar2->errors = pMVar3;
          if (ctx->out_of_memory != 0) {
            (*ctx->free)(pMVar2,ctx->malloc_data);
            pMVar2 = &MOJOSHADER_out_of_mem_ast_data;
          }
        }
      }
      destroy_context(ctx);
      return pMVar2;
    }
    if (ctx->out_of_memory == 0) {
      pMVar2 = (MOJOSHADER_astData *)(*ctx->malloc)(0x40,ctx->malloc_data);
      if (pMVar2 == (MOJOSHADER_astData *)0x0) {
        ctx->isfail = 1;
        ctx->out_of_memory = 1;
      }
      else {
        pMVar2->malloc_data = (void *)0x0;
        pMVar2->opaque = (void *)0x0;
        pMVar2->malloc = (MOJOSHADER_malloc)0x0;
        pMVar2->free = (MOJOSHADER_free)0x0;
        pMVar2->source_profile = (char *)0x0;
        pMVar2->ast = (MOJOSHADER_astNode *)0x0;
        *(undefined8 *)pMVar2 = 0;
        pMVar2->errors = (MOJOSHADER_error *)0x0;
        p_Var4 = (MOJOSHADER_free)ctx->malloc;
        if (ctx->malloc == MOJOSHADER_internal_malloc) {
          p_Var4 = (MOJOSHADER_free)0x0;
        }
        pMVar2->malloc = (MOJOSHADER_malloc)p_Var4;
        p_Var4 = ctx->free;
        if (ctx->free == MOJOSHADER_internal_free) {
          p_Var4 = (MOJOSHADER_free)0x0;
        }
        pMVar2->free = p_Var4;
        pMVar2->malloc_data = ctx->malloc_data;
        if (ctx->isfail == 0) {
          pMVar2->source_profile = ctx->source_profile;
          pMVar2->ast = ctx->ast;
        }
        iVar1 = errorlist_count(ctx->errors);
        pMVar2->error_count = iVar1;
        pMVar3 = errorlist_flatten(ctx->errors);
        pMVar2->errors = pMVar3;
        if (ctx->out_of_memory == 0) {
          pMVar2->opaque = ctx;
          return pMVar2;
        }
        (*ctx->free)(pMVar2,ctx->malloc_data);
      }
    }
  }
  return &MOJOSHADER_out_of_mem_ast_data;
}

Assistant:

const MOJOSHADER_astData *MOJOSHADER_parseAst(const char *srcprofile,
                                    const char *filename, const char *source,
                                    unsigned int sourcelen,
                                    const MOJOSHADER_preprocessorDefine *defs,
                                    unsigned int define_count,
                                    MOJOSHADER_includeOpen include_open,
                                    MOJOSHADER_includeClose include_close,
                                    MOJOSHADER_malloc m, MOJOSHADER_free f,
                                    void *d)
{
    const MOJOSHADER_astData *retval = NULL;
    Context *ctx = NULL;

    if ( ((m == NULL) && (f != NULL)) || ((m != NULL) && (f == NULL)) )
        return &MOJOSHADER_out_of_mem_ast_data;  // supply both or neither.

    ctx = build_context(m, f, d);
    if (ctx == NULL)
        return &MOJOSHADER_out_of_mem_ast_data;

    choose_src_profile(ctx, srcprofile);

    if (!isfail(ctx))
    {
        parse_source(ctx, filename, source, sourcelen, defs, define_count,
                     include_open, include_close);
    } // if

    if (!isfail(ctx))
        retval = build_astdata(ctx);  // ctx isn't destroyed yet!
    else
    {
        retval = (MOJOSHADER_astData *) build_failed_ast(ctx);
        destroy_context(ctx);
    } // else

    return retval;
}